

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

char * __thiscall
Memory::LargeHeapBucket::PageHeapAlloc
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,size_t size,
          ObjectInfoBits attributes,PageHeapMode mode,bool nothrow)

{
  size_t *psVar1;
  PageHeapMode PVar2;
  Boolean BVar3;
  HeapBlockType HVar4;
  undefined4 *puVar5;
  HeapInfo *this_00;
  code *pcVar6;
  bool bVar7;
  uint uVar8;
  BOOL BVar9;
  HeapAllocator *pHVar10;
  type_info *ptVar11;
  IdleDecommitPageAllocator *pIVar12;
  char *pcVar13;
  LargeHeapBlock *this_01;
  Recycler *pRVar14;
  uint uVar15;
  undefined6 in_register_00000082;
  size_t sVar16;
  LargeHeapBucket *pLVar17;
  char *lpAddress;
  PageHeapData *pPVar18;
  undefined8 *in_FS_OFFSET;
  pointer_____offset_0x10___ *local_b0;
  size_t actualPageCount;
  size_t local_a0;
  char *local_98;
  DWORD local_90;
  DWORD local_84;
  long lStack_80;
  DWORD oldProtect;
  char *local_78;
  Segment *local_70;
  Segment *segment;
  Recycler *local_60;
  IdleDecommitPageAllocator *local_58;
  type_info *local_50;
  LargeHeapBucket *local_48;
  size_t local_40;
  PageHeapData *local_38;
  
  pHVar10 = HeapAllocator::GetNoMemProtectInstance();
  local_b0 = &PageHeapData::typeinfo;
  actualPageCount = 0;
  local_a0 = 0xffffffffffffffff;
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
  ;
  local_90 = 0x7a;
  pHVar10 = HeapAllocator::TrackAllocInfo(pHVar10,(TrackAllocData *)&stack0xffffffffffffff50);
  local_38 = (PageHeapData *)HeapAllocator::AllocT<true>(pHVar10,0x48);
  local_38->isLockedWithPageHeap = false;
  local_38->isGuardPageDecommitted = false;
  local_38->pageHeapMode = PageHeapModeOff;
  local_38->field_0x3 = 0;
  local_38->actualPageCount = 0;
  local_38->paddingBytes = 0;
  local_38->unusedBytes = 0;
  *(undefined4 *)&local_38->field_0xc = 0;
  local_38->guardPageAddress = (char *)0x0;
  local_38->objectAddress = (char *)0x0;
  local_38->objectEndAddr = (char *)0x0;
  local_38->objectPageAddr = (char *)0x0;
  local_38->lastMarkedBy = (char *)0x0;
  local_38->pageHeapAllocStack = (StackBackTrace *)0x0;
  local_38->pageHeapFreeStack = (StackBackTrace *)0x0;
  uVar8 = (uint)CONCAT62(in_register_00000082,attributes);
  segment._4_4_ = uVar8 | 0x20;
  if (7 < size) {
    segment._4_4_ = uVar8;
  }
  if (recycler->verifyEnabled == false) {
    sizeCat = size;
  }
  local_60 = recycler;
  local_40 = sizeCat;
  ptVar11 = (type_info *)LargeHeapBlock::GetPagesNeeded(sizeCat,false);
  local_48 = this;
  if (ptVar11 == (type_info *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)*in_FS_OFFSET;
    *puVar5 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x8f,"(pageCount != 0)","pageCount != 0");
    if (!bVar7) goto LAB_0024d399;
    *puVar5 = 0;
  }
  pLVar17 = local_48;
  local_b0 = (pointer_____offset_0x10___ *)(ptVar11 + 1);
  local_50 = ptVar11;
  pIVar12 = HeapInfo::GetRecyclerLargeBlockPageAllocator((local_48->super_HeapBucket).heapInfo);
  pcVar13 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::Alloc(&pIVar12->super_PageAllocator,(size_t *)&stack0xffffffffffffff50,&local_70);
  pPVar18 = local_38;
  if (((ulong)pcVar13 & 0xfff) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)*in_FS_OFFSET;
    *puVar5 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x94,"((size_t)baseAddress%AutoSystemInfo::PageSize == 0)",
                       "(size_t)baseAddress%AutoSystemInfo::PageSize == 0");
    if (!bVar7) goto LAB_0024d399;
    *puVar5 = 0;
  }
  if (pcVar13 == (char *)0x0) {
    pHVar10 = HeapAllocator::GetNoMemProtectInstance();
    PageHeapData::~PageHeapData(pPVar18);
    HeapAllocator::Free(pHVar10,pPVar18,0x48);
    pRVar14 = local_60;
  }
  else {
    lStack_80 = (long)local_b0 - (long)local_50;
    PVar2 = ((pLVar17->super_HeapBucket).heapInfo)->pageHeapMode;
    pPVar18->pageHeapMode = PVar2;
    local_58 = pIVar12;
    if (PVar2 == PageHeapModeBlockEnd) {
      pPVar18->unusedBytes = (ushort)(-(int)local_40 & 0xfU);
      uVar15 = -((-(int)local_40 & 0xfU) + (int)local_40) - 0x20;
      uVar8 = uVar15 & 0xfff;
      pPVar18->paddingBytes = (ushort)uVar8;
      if ((uVar15 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)*in_FS_OFFSET;
        *puVar5 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0xae,
                           "(pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0)",
                           "pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0");
        if (!bVar7) goto LAB_0024d399;
        *puVar5 = 0;
        uVar8 = (uint)pPVar18->paddingBytes;
      }
      local_78 = pcVar13 + uVar8;
      lpAddress = pcVar13 + (long)local_50 * 0x1000;
      pPVar18->objectPageAddr = pcVar13;
    }
    else if (PVar2 == PageHeapModeBlockStart) {
      local_78 = pcVar13 + lStack_80 * 0x1000;
      pPVar18->paddingBytes = 0;
      pPVar18->unusedBytes = 0xfe0U - (short)local_40 & 0xfff;
      pPVar18->objectPageAddr = local_78;
      lpAddress = pcVar13;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)*in_FS_OFFSET;
      *puVar5 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0xb7,"(false)","false");
      if (!bVar7) goto LAB_0024d399;
      *puVar5 = 0;
      local_78 = (char *)0x0;
      lpAddress = (char *)0x0;
    }
    pLVar17 = local_48;
    ptVar11 = local_50;
    this_01 = LargeHeapBlock::New(local_78,(size_t)local_50,local_70,1,local_48);
    pIVar12 = local_58;
    if (this_01 == (LargeHeapBlock *)0x0) {
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&local_58->super_PageAllocator);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::Release(&pIVar12->super_PageAllocator,pcVar13,(size_t)local_b0,local_70);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&pIVar12->super_PageAllocator);
      pHVar10 = HeapAllocator::GetNoMemProtectInstance();
      pPVar18 = local_38;
      PageHeapData::~PageHeapData(local_38);
      HeapAllocator::Free(pHVar10,pPVar18,0x48);
      pRVar14 = local_60;
    }
    else {
      if (local_38->pageHeapMode == PageHeapModeBlockStart) {
        ptVar11 = (type_info *)local_b0;
      }
      this_01->addressEnd = pcVar13 + (long)ptVar11 * 0x1000;
      local_38->actualPageCount = (uint)local_b0;
      local_38->guardPageAddress = lpAddress;
      this_01->heapInfo = (pLVar17->super_HeapBucket).heapInfo;
      this_01->pageHeapData = local_38;
      pRVar14 = HeapBucket::GetRecycler(&pLVar17->super_HeapBucket);
      BVar3 = pRVar14->recyclerFlagsTable->PageHeapDecommitGuardPage;
      this_00 = (pLVar17->super_HeapBucket).heapInfo;
      HVar4 = (this_01->super_HeapBlock).heapBlockType;
      if (HVar4 < 0xc) {
        if ((0x630U >> (HVar4 & 0x1f) & 1) == 0) {
          if ((0x84U >> (HVar4 & 0x1f) & 1) == 0) {
            if (HVar4 != 0xb) goto LAB_0024d1cb;
            pIVar12 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this_00);
          }
          else {
            pIVar12 = HeapInfo::GetRecyclerLeafPageAllocator(this_00);
          }
        }
        else {
          pIVar12 = HeapInfo::GetRecyclerWithBarrierPageAllocator(this_00);
        }
      }
      else {
LAB_0024d1cb:
        pIVar12 = HeapInfo::GetRecyclerPageAllocator(this_00);
      }
      if (BVar3 == false && (pIVar12->super_PageAllocator).disablePageReuse == false) {
        BVar9 = VirtualProtect(lpAddress,lStack_80 << 0xc,1,&local_84);
        if (BVar9 == 0) goto LAB_0024d39b;
        local_38->isGuardPageDecommitted = false;
      }
      else {
        BVar9 = VirtualFree(lpAddress,lStack_80 << 0xc,0x4000);
        if (BVar9 == 0) {
LAB_0024d39b:
          Js::Throw::FatalInternalError(-0x7fffbffb);
        }
        local_38->isGuardPageDecommitted = true;
      }
      pPVar18 = local_38;
      sVar16 = local_40;
      pLVar17 = local_48;
      pcVar13 = LargeHeapBlock::Alloc(this_01,local_40,segment._4_2_);
      pRVar14 = local_60;
      pPVar18->objectAddress = pcVar13;
      if (pcVar13 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)*in_FS_OFFSET;
        *puVar5 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0xf6,"(pageHeapData->objectAddress != nullptr)",
                           "pageHeapData->objectAddress != nullptr");
        if (!bVar7) {
LAB_0024d399:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar5 = 0;
        pcVar13 = local_38->objectAddress;
        sVar16 = local_40;
        pLVar17 = local_48;
        pPVar18 = local_38;
        if (pcVar13 != (char *)0x0) goto LAB_0024d2b9;
      }
      else {
LAB_0024d2b9:
        pPVar18->objectEndAddr = pcVar13 + sVar16;
        memset(pPVar18->objectPageAddr,0xf0,(ulong)pPVar18->paddingBytes);
        memset(pPVar18->objectAddress + sVar16,0xf0,(ulong)pPVar18->unusedBytes);
        ptVar11 = local_50;
        bVar7 = HeapBlockMap64::SetHeapBlock
                          (&pRVar14->heapBlockMap,local_78,(size_t)local_50,
                           &this_01->super_HeapBlock,LargeBlockType,'\0');
        if (bVar7) {
          this_01->next = pLVar17->largePageHeapBlockList;
          pLVar17->largePageHeapBlockList = this_01;
          psVar1 = &(pRVar14->autoHeap).uncollectedNewPageCount;
          *psVar1 = (size_t)(ptVar11 + *psVar1);
          psVar1 = ((pLVar17->super_HeapBucket).heapInfo)->heapBlockCount + 0xb;
          *psVar1 = *psVar1 + 1;
          if (pRVar14->capturePageHeapAllocStack == true) {
            LargeHeapBlock::CapturePageHeapAllocStack(this_01);
          }
          if (pPVar18->objectAddress != (char *)0x0 || nothrow) {
            return pPVar18->objectAddress;
          }
          goto LAB_0024d37d;
        }
      }
      pIVar12 = local_58;
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&local_58->super_PageAllocator);
      LargeHeapBlock::ReleasePages(this_01,pRVar14);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&pIVar12->super_PageAllocator);
      LargeHeapBlock::Delete(this_01);
    }
  }
  if (nothrow) {
    return (char *)0x0;
  }
LAB_0024d37d:
  Recycler::OutOfMemory(pRVar14);
  return (char *)0x0;
}

Assistant:

char*
LargeHeapBucket::PageHeapAlloc(Recycler * recycler, size_t sizeCat, size_t size, ObjectInfoBits attributes, PageHeapMode mode, bool nothrow)
{
    auto throwOrReturn = [&](char* memBlock) ->char*
    {
        if (memBlock==nullptr && !nothrow)
        {
            recycler->OutOfMemory();
        }
        return memBlock;
    };

    PageHeapData* pageHeapData = NoMemProtectHeapNewNoThrowZ(PageHeapData);
    if (pageHeapData == nullptr)
    {
        return throwOrReturn(nullptr);
    }


    if (size < sizeof(void*))
    {
        attributes = (ObjectInfoBits)(attributes | LeafBit);
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (recycler->VerifyEnabled())
    {
        // with recycler verify enabled, it uses the unaligned bytes
        size = sizeCat;
    }
#endif

    size_t pageCount = LargeHeapBlock::GetPagesNeeded(size, false);
    Assert(pageCount != 0);
    size_t actualPageCount = pageCount + 1; // 1 for guard page
    auto pageAllocator = heapInfo->GetRecyclerLargeBlockPageAllocator();
    Segment * segment;
    char * baseAddress = pageAllocator->Alloc(&actualPageCount, &segment);
    Assert((size_t)baseAddress%AutoSystemInfo::PageSize == 0);
    if (baseAddress == nullptr)
    {
        NoMemProtectHeapDelete(pageHeapData);
        return throwOrReturn(nullptr);
    }

    size_t guardPageCount = actualPageCount - pageCount; // pageAllocator can return more than asked pages
    char* headerAddress = nullptr;
    char* guardPageAddress = nullptr;
    size_t sizeWithHeader = size + sizeof(LargeObjectHeader);
    pageHeapData->pageHeapMode = heapInfo->pageHeapMode;
    if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart)
    {
        headerAddress = baseAddress + AutoSystemInfo::PageSize * guardPageCount;
        guardPageAddress = baseAddress;

        pageHeapData->paddingBytes = 0;
        pageHeapData->unusedBytes = (AutoSystemInfo::PageSize - (sizeWithHeader%AutoSystemInfo::PageSize)) % AutoSystemInfo::PageSize;

        pageHeapData->objectPageAddr = headerAddress;
    }
    else if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockEnd)
    {
        pageHeapData->unusedBytes = (HeapConstants::ObjectGranularity - (sizeWithHeader%HeapConstants::ObjectGranularity)) % HeapConstants::ObjectGranularity;
        pageHeapData->paddingBytes = (ushort)((AutoSystemInfo::PageSize - pageHeapData->unusedBytes - sizeWithHeader%AutoSystemInfo::PageSize) % AutoSystemInfo::PageSize);
        Assert(pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0);

        headerAddress = baseAddress + pageHeapData->paddingBytes;
        guardPageAddress = baseAddress + pageCount * AutoSystemInfo::PageSize;

        pageHeapData->objectPageAddr = baseAddress;
    }
    else
    {
        AnalysisAssert(false);
    }

    LargeHeapBlock * heapBlock = LargeHeapBlock::New(headerAddress, pageCount, segment, 1, this);
    if (!heapBlock)
    {
        pageAllocator->SuspendIdleDecommit();
        pageAllocator->Release(baseAddress, actualPageCount, segment);
        pageAllocator->ResumeIdleDecommit();
        NoMemProtectHeapDelete(pageHeapData);
        return throwOrReturn(nullptr);
    }


    // adjust the addressEnd
    if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart)
    {
        heapBlock->addressEnd = baseAddress + AutoSystemInfo::PageSize * actualPageCount;
    }
    else
    {
        heapBlock->addressEnd = baseAddress + AutoSystemInfo::PageSize * pageCount;
    }

    pageHeapData->actualPageCount = (uint)actualPageCount;
    pageHeapData->guardPageAddress = guardPageAddress;

    heapBlock->heapInfo = this->heapInfo;
    heapBlock->pageHeapData = pageHeapData;
    
    bool decommitGuardPage = true;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    decommitGuardPage = this->GetRecycler()->GetRecyclerFlagsTable().PageHeapDecommitGuardPage;
#if defined(RECYCLER_NO_PAGE_REUSE)
    decommitGuardPage |= heapBlock->GetPageAllocator(heapInfo)->IsPageReuseDisabled();
#endif
#endif
    if (decommitGuardPage)
    {
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        if (VirtualFree(guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, MEM_DECOMMIT))
        {
            pageHeapData->isGuardPageDecommitted = true;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }
    }
    else
    {
        DWORD oldProtect;
        if (VirtualProtect(guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, PAGE_NOACCESS, &oldProtect))
        {
            pageHeapData->isGuardPageDecommitted = false;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }        
    }

    pageHeapData->objectAddress = heapBlock->Alloc(size, attributes);
    Assert(pageHeapData->objectAddress != nullptr);
    if (!pageHeapData->objectAddress)
    {
        pageAllocator->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        pageAllocator->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        return throwOrReturn(nullptr);
    }

    pageHeapData->objectEndAddr = pageHeapData->objectAddress + size;

    // fill pattern before set pageHeapMode, so background scan stack may verify the pattern
    memset(pageHeapData->objectPageAddr, PageHeapMemFill, pageHeapData->paddingBytes);
    memset(pageHeapData->objectAddress + size, PageHeapMemFill, pageHeapData->unusedBytes);

    if (!recycler->heapBlockMap.SetHeapBlock(headerAddress, pageCount, heapBlock, HeapBlock::HeapBlockType::LargeBlockType, 0))
    {
        pageAllocator->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        pageAllocator->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        return throwOrReturn(nullptr);
    }

    heapBlock->SetNextBlock(this->largePageHeapBlockList);
    this->largePageHeapBlockList = heapBlock;

#if ENABLE_PARTIAL_GC
    recycler->autoHeap.uncollectedNewPageCount += pageCount;
#endif

    RECYCLER_SLOW_CHECK(this->heapInfo->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]++);
    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, heapBlock->GetPageCount() * AutoSystemInfo::PageSize);

#ifdef STACK_BACK_TRACE
    if (recycler->ShouldCapturePageHeapAllocStack())
    {
        heapBlock->CapturePageHeapAllocStack();
    }
#endif

    return throwOrReturn(pageHeapData->objectAddress);
}